

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

char * duckdb_yyjson::yyjson_read_number
                 (char *dat,yyjson_val *val,yyjson_read_flag flg,yyjson_alc *alc,
                 yyjson_read_err *err)

{
  ulong *puVar1;
  char cVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  sbyte sVar20;
  ulong uVar21;
  char *pcVar22;
  byte bVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  u8 **ppuVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  byte bVar32;
  int iVar33;
  uint uVar34;
  byte *pbVar35;
  ulong uVar36;
  byte *pbVar37;
  uint64_t uVar38;
  byte *pbVar39;
  char cVar40;
  long lVar41;
  ulong uVar42;
  byte *pbVar43;
  long lVar44;
  bool bVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  byte *local_480;
  byte *local_478;
  char *msg;
  yyjson_val *local_468;
  i32 exp;
  byte *local_458;
  byte *local_450;
  u8 *raw_end;
  bigint big_full;
  ulong auStack_238 [65];
  
  if (dat == (char *)0x0) {
    if (err == (yyjson_read_err *)0x0) {
      return (char *)0x0;
    }
    err->pos = 0;
    pcVar22 = "input data is NULL";
LAB_01f45632:
    err->msg = pcVar22;
    err->code = 1;
    return (char *)0x0;
  }
  if (val == (yyjson_val *)0x0) {
    if (err == (yyjson_read_err *)0x0) {
      return (char *)0x0;
    }
    err->pos = 0;
    pcVar22 = "output value is NULL";
    goto LAB_01f45632;
  }
  raw_end = (u8 *)0x0;
  cVar40 = (char)flg;
  bVar45 = (flg & 0xa0) != 0;
  ppuVar28 = (u8 **)0x0;
  if (bVar45) {
    ppuVar28 = &raw_end;
  }
  exp = 0;
  if (-1 < cVar40 && bVar45) {
    local_478 = (byte *)dat;
    bVar45 = read_number_raw(&local_478,&raw_end,flg,val,&msg);
    if (bVar45) {
      return (char *)local_478;
    }
    goto LAB_01f455e1;
  }
  cVar2 = *dat;
  uVar24 = (ulong)(cVar2 == '-');
  pbVar37 = (byte *)(dat + uVar24);
  bVar23 = dat[uVar24];
  uVar21 = (ulong)bVar23;
  if ((digi_table[uVar21] & 2) != 0) {
    uVar24 = uVar21 - 0x30;
    bVar23 = pbVar37[1];
    uVar42 = (ulong)bVar23 - 0x30;
    if (uVar42 < 10) {
      uVar24 = uVar42 + uVar24 * 10;
      bVar23 = pbVar37[2];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 2;
        if ((digi_table[bVar23] & 0x30) == 0) {
          val->tag = (ulong)(cVar2 == '-') * 8 + 4;
          uVar42 = -uVar24;
          if (cVar2 != '-') {
            uVar42 = uVar24;
          }
          goto LAB_01f45592;
        }
        local_480 = pbVar43;
        if (bVar23 == 0x2e) goto LAB_01f46149;
        goto LAB_01f451ef;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[3];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 3;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f46166;
        }
LAB_01f45993:
        val->tag = (ulong)(cVar2 == '-') * 8 + 4;
        uVar42 = -uVar24;
        if (cVar2 != '-') {
          uVar42 = uVar24;
        }
        goto LAB_01f45592;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[4];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 4;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f46183;
        }
LAB_01f459cd:
        val->tag = (ulong)(cVar2 == '-') * 8 + 4;
        uVar42 = -uVar24;
        if (cVar2 != '-') {
          uVar42 = uVar24;
        }
        goto LAB_01f45592;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[5];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 5;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f461a0;
        }
        goto LAB_01f45993;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[6];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 6;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f461bd;
        }
        goto LAB_01f459cd;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[7];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 7;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f461da;
        }
        goto LAB_01f45993;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[8];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 8;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f461f7;
        }
        goto LAB_01f459cd;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[9];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 9;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f46214;
        }
        goto LAB_01f45993;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[10];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 10;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f46231;
        }
        goto LAB_01f459cd;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[0xb];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 0xb;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f4624e;
        }
        goto LAB_01f45993;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[0xc];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 0xc;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f4626b;
        }
        goto LAB_01f459cd;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[0xd];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 0xd;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f46288;
        }
        goto LAB_01f45993;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[0xe];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 0xe;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f462a5;
        }
        goto LAB_01f459cd;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[0xf];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 0xf;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f462c2;
        }
        goto LAB_01f45993;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[0x10];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 0x10;
        if ((digi_table[bVar23] & 0x30) != 0) {
          local_480 = pbVar43;
          if (bVar23 != 0x2e) goto LAB_01f451ef;
          goto LAB_01f462df;
        }
        goto LAB_01f459cd;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[0x11];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 0x11;
        if ((digi_table[bVar23] & 0x30) == 0) goto LAB_01f45993;
        local_480 = pbVar43;
        if (bVar23 == 0x2e) goto LAB_01f462fc;
LAB_01f451ef:
        pbVar39 = (byte *)0x0;
        pbVar37 = (byte *)0x0;
        local_478 = pbVar43;
        local_450 = pbVar43;
        goto LAB_01f45386;
      }
      uVar24 = uVar21 + uVar24 * 10;
      bVar23 = pbVar37[0x12];
      uVar21 = (ulong)bVar23 - 0x30;
      if (9 < uVar21) {
        pbVar43 = pbVar37 + 0x12;
        if ((digi_table[bVar23] & 0x30) == 0) goto LAB_01f459cd;
        local_480 = pbVar43;
        if (bVar23 == 0x2e) goto LAB_01f46319;
        goto LAB_01f451ef;
      }
      uVar24 = uVar21 + uVar24 * 10;
      pbVar43 = pbVar37 + 0x13;
      bVar32 = pbVar37[0x13];
      bVar23 = digi_table[bVar32];
      if ((bVar23 & 0x33) == 0) {
        if ((cVar2 == '-') && (0x8000000000000000 < uVar24)) {
          if (cVar40 < '\0') {
            if (*ppuVar28 != (u8 *)0x0) {
              **ppuVar28 = '\0';
            }
            val->tag = ((long)pbVar43 - (long)dat) * 0x100 + 1;
            (val->uni).str = dat;
            *ppuVar28 = pbVar43;
            return (char *)pbVar43;
          }
          auVar47._8_4_ = (int)(uVar24 >> 0x20);
          auVar47._0_8_ = uVar24;
          auVar47._12_4_ = 0x45300000;
          val->tag = 0x14;
          (val->uni).f64 =
               -((auVar47._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar24) - 4503599627370496.0));
          return (char *)pbVar43;
        }
        val->tag = (ulong)(cVar2 == '-') * 8 + 4;
        uVar38 = -uVar24;
        if (cVar2 != '-') {
          uVar38 = uVar24;
        }
        (val->uni).u64 = uVar38;
        return (char *)pbVar43;
      }
      if (((bVar23 & 3) != 0) && ((digi_table[pbVar37[0x14]] & 0x33) == 0)) {
        uVar21 = (ulong)bVar32 - 0x30;
        if ((uVar24 < 0x1999999999999999) || ((uVar24 == 0x1999999999999999 && (uVar21 < 6)))) {
          pbVar37 = pbVar37 + 0x14;
          uVar38 = uVar21 + uVar24 * 10;
          if (cVar2 != '-') {
            val->tag = 4;
            (val->uni).u64 = uVar38;
            return (char *)pbVar37;
          }
          if (cVar40 < '\0') {
            if (*ppuVar28 != (u8 *)0x0) {
              **ppuVar28 = '\0';
            }
            val->tag = ((long)pbVar37 - (long)dat) * 0x100 + 1;
            (val->uni).str = dat;
            *ppuVar28 = pbVar37;
            return (char *)pbVar37;
          }
          auVar48._8_4_ = (int)(uVar38 >> 0x20);
          auVar48._0_8_ = uVar38;
          auVar48._12_4_ = 0x45300000;
          val->tag = 0x14;
          (val->uni).f64 =
               -((auVar48._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar38) - 4503599627370496.0));
          return (char *)pbVar37;
        }
      }
      if ((bVar23 & 0x20) != 0) {
        local_480 = (byte *)0x0;
        goto LAB_01f451ef;
      }
      if (bVar32 == 0x2e) {
        bVar32 = pbVar37[0x14];
        local_478 = pbVar37 + 0x14;
        local_450 = pbVar43;
        if ((digi_table[bVar32] & 3) == 0) goto LAB_01f45177;
      }
      else {
        local_478 = pbVar43;
        local_450 = (byte *)0x0;
      }
LAB_01f452a3:
      uVar38 = (long)local_478 * 0x100 + (long)dat * -0x100 + 1;
      pbVar37 = local_478 + 1;
      do {
        pbVar39 = pbVar37;
        bVar23 = digi_table[*pbVar39];
        pbVar37 = pbVar39 + 1;
        uVar38 = uVar38 + 0x100;
      } while ((bVar23 & 3) != 0);
      pbVar43 = pbVar39;
      if (local_450 == (byte *)0x0) {
        if ((cVar40 < '\0') && ((bVar23 & 0x30) == 0)) {
          if (*ppuVar28 != (u8 *)0x0) {
            **ppuVar28 = '\0';
          }
          val->tag = uVar38;
          (val->uni).str = dat;
          *ppuVar28 = pbVar39;
          return (char *)pbVar39;
        }
        local_450 = pbVar39;
        if (*pbVar39 == 0x2e) {
          if ((digi_table[*pbVar37] & 3) == 0) {
            msg = "no digit after decimal point";
            local_478 = pbVar37;
            goto LAB_01f455e1;
          }
          do {
            pbVar43 = pbVar39 + 1;
            bVar23 = digi_table[pbVar39[1]];
            pbVar39 = pbVar43;
          } while ((bVar23 & 3) != 0);
        }
      }
      uVar24 = uVar24 + (0x34 < bVar32);
      pbVar35 = pbVar43;
      do {
        do {
          pbVar35 = pbVar35 + -1;
        } while (*pbVar35 == 0x30);
      } while (*pbVar35 == 0x2e);
      pbVar39 = local_450 + ((ulong)(local_450 < local_478) - (long)local_478);
      pbVar37 = local_478;
      local_480 = pbVar43;
      if (pbVar35 < local_478) {
        pbVar37 = (byte *)0x0;
        local_480 = (byte *)0x0;
      }
      local_478 = pbVar43;
      if ((bVar23 & 0x20) != 0) goto LAB_01f45386;
LAB_01f4542a:
      if ((long)pbVar39 < -0x157) {
LAB_01f4638e:
        val->tag = 0x14;
        uVar42 = (ulong)(cVar2 == '-') << 0x3f;
        goto LAB_01f45592;
      }
      if (0x134 < (long)pbVar39) {
        if (cVar40 < '\0') {
          if (*ppuVar28 != (u8 *)0x0) {
            **ppuVar28 = '\0';
          }
          val->tag = ((long)pbVar43 - (long)dat) * 0x100 + 1;
          (val->uni).str = dat;
          goto LAB_01f46468;
        }
        if ((flg & 0x10) != 0) goto LAB_01f4673f;
        msg = "number is infinity when parsed as double";
        local_478 = (byte *)dat;
        goto LAB_01f455e1;
      }
LAB_01f45444:
      exp = (i32)pbVar39;
      if ((uVar24 >> 0x35 == 0) && (exp + 0x16U < 0x2d)) {
        if (exp < 0) {
          dVar46 = (double)(long)uVar24 / *(double *)(f64_pow10_table + (ulong)(uint)-exp * 8);
        }
        else {
          dVar46 = (double)(long)uVar24 *
                   *(double *)(f64_pow10_table + (ulong)(exp & 0x7fffffff) * 8);
        }
        val->tag = 0x14;
        if (cVar2 == '-') {
          dVar46 = -dVar46;
        }
        (val->uni).f64 = dVar46;
        return (char *)pbVar43;
      }
      if ((exp + 0x132U < 0x252) && (pbVar37 == (byte *)0x0)) {
        lVar29 = (long)(exp * 2 + 0x2ae);
        uVar21 = 0x3f;
        if (uVar24 != 0) {
          for (; uVar24 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        iVar33 = (int)(uVar21 ^ 0x3f);
        uVar42 = uVar24 << ((byte)(uVar21 ^ 0x3f) & 0x3f);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar42;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(pow10_sig_table + lVar29 * 8);
        auVar4 = auVar4 * auVar9;
        lVar41 = auVar4._8_8_;
        uVar21 = auVar4._0_8_;
        iVar26 = exp * 0x3526a + -0x3f0000 >> 0x10;
        if (0x1fd < (ulong)(auVar4._8_4_ & 0x1ff) - 1) {
          lVar44 = (long)(exp * 2 + 0x2af);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar42;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(pow10_sig_table + lVar44 * 8);
          lVar25 = SUB168(auVar5 * auVar10,8);
          if (0xfffffffffffffffd < (lVar25 + uVar21) - 1) goto LAB_01f45ace;
          lVar41 = lVar41 + (ulong)(lVar25 + uVar21 < uVar21);
        }
        uVar21 = lVar41 << (-1 < lVar41);
        uVar21 = (uVar21 & 0x400) + uVar21;
        val->tag = 0x14;
        uVar42 = (ulong)(cVar2 == '-') << 0x3f |
                 uVar21 >> 0xb & 0xfffffffffffff |
                 (ulong)(((iVar26 - iVar33) - (uint)(-1 < lVar41)) + 0x47e + (uint)(uVar21 < 0x400))
                 << 0x34;
        goto LAB_01f45592;
      }
      uVar21 = 0x3f;
      if (uVar24 != 0) {
        for (; uVar24 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      iVar33 = (int)(uVar21 ^ 0x3f);
      uVar42 = uVar24 << ((byte)(uVar21 ^ 0x3f) & 0x3f);
      lVar29 = (long)(exp * 2 + 0x2ae);
      lVar44 = (long)(exp * 2 + 0x2af);
      iVar26 = exp * 0x3526a + -0x3f0000 >> 0x10;
LAB_01f45ace:
      lVar41 = ((ulong)(pbVar37 != (byte *)0x0) << 2) << ((byte)iVar33 & 0x3f);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar42;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           *(long *)(pow10_sig_table + lVar29 * 8) -
           (*(long *)(pow10_sig_table + lVar44 * 8) >> 0x3f);
      uVar42 = SUB168(auVar6 * auVar11,8) - (SUB168(auVar6 * auVar11,0) >> 0x3f);
      uVar21 = 0x3f;
      if (uVar42 != 0) {
        for (; uVar42 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      bVar23 = (byte)(uVar21 ^ 0x3f);
      uVar42 = uVar42 << (bVar23 & 0x3f);
      uVar27 = ((iVar26 - (int)(uVar21 ^ 0x3f)) - iVar33) + 0x40;
      uVar21 = (9 - (ulong)(lVar41 == 0)) + lVar41 << (bVar23 & 0x3f);
      if ((int)uVar27 < -0x43d) {
        if (uVar27 < 0xfffffb8f) {
          iVar26 = 0x40;
        }
        else {
          iVar26 = -0x432 - uVar27;
          if (0xfffffb91 < uVar27) goto LAB_01f45b3e;
        }
        bVar23 = (char)iVar26 - 0x3c;
        uVar42 = uVar42 >> (bVar23 & 0x3f);
        uVar27 = (uVar27 + iVar26) - 0x3c;
        uVar21 = (uVar21 >> (bVar23 & 0x3f)) + 9;
        iVar26 = 0x3c;
      }
      else {
        iVar26 = 0xb;
      }
LAB_01f45b3e:
      bVar23 = (byte)iVar26;
      lVar29 = 8L << (bVar23 - 1 & 0x3f);
      uVar36 = (~(-1L << (bVar23 & 0x3f)) & uVar42) * 8;
      uVar31 = lVar29 + uVar21;
      uVar38 = 0x7ff0000000000000;
      uVar42 = (ulong)(uVar31 <= uVar36) + (uVar42 >> (bVar23 & 0x3f));
      local_458 = (byte *)dat;
      local_468 = val;
      if (uVar42 == 0) {
LAB_01f45d7b:
        uVar42 = 0;
LAB_01f45bc9:
        if ((uVar36 <= lVar29 - uVar21) || (uVar31 <= uVar36)) {
          val->tag = 0x14;
          (val->uni).u64 = uVar42 | (ulong)(cVar2 == '-') << 0x3f;
          return (char *)pbVar43;
        }
        uVar27 = 0xfffffbcd;
        if (0xfffffffffffff < uVar42) {
          uVar27 = (uint)(uVar42 >> 0x34) - 0x434;
        }
        uVar21 = (uVar42 & 0xfffffffffffff) + 0x10000000000000;
        if (0xfffffffffffff >= uVar42) {
          uVar21 = uVar42;
        }
        local_478 = (byte *)dat;
        bigint_set_buf(&big_full,uVar24,&exp,pbVar37,local_480,local_450);
        auStack_238[1] = uVar21 * 2 + 1;
        if (exp < 0) {
          uVar30 = 1;
          for (iVar26 = -exp; uVar21 = (ulong)uVar30, 0x12 < iVar26; iVar26 = iVar26 + -0x13) {
            for (uVar24 = 0;
                (uVar31 = uVar21, uVar21 != uVar24 &&
                (uVar31 = uVar24, auStack_238[uVar24 + 1] == 0)); uVar24 = uVar24 + 1) {
            }
            uVar24 = 0;
            for (; auVar17._8_8_ = 0, auVar17._0_8_ = uVar24, uVar31 < uVar21; uVar31 = uVar31 + 1)
            {
              auVar13._8_8_ = 0;
              auVar13._0_8_ = auStack_238[uVar31 + 1];
              auVar17 = ZEXT816(10000000000000000000) * auVar13 + auVar17;
              uVar24 = auVar17._8_8_;
              auStack_238[uVar31 + 1] = auVar17._0_8_;
            }
            if (uVar24 != 0) {
              uVar30 = uVar30 + 1;
              auStack_238[uVar21 + 1] = uVar24;
            }
          }
          if (iVar26 != 0) {
            uVar24 = *(ulong *)(u64_pow10_table + (long)iVar26 * 8);
            for (uVar31 = 0;
                (uVar36 = uVar21, uVar21 != uVar31 &&
                (uVar36 = uVar31, auStack_238[uVar31 + 1] == 0)); uVar31 = uVar31 + 1) {
            }
            uVar31 = 0;
            for (; auVar19._8_8_ = 0, auVar19._0_8_ = uVar31, uVar36 < uVar21; uVar36 = uVar36 + 1)
            {
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uVar24;
              auVar15._8_8_ = 0;
              auVar15._0_8_ = auStack_238[uVar36 + 1];
              auVar19 = auVar8 * auVar15 + auVar19;
              uVar31 = auVar19._8_8_;
              auStack_238[uVar36 + 1] = auVar19._0_8_;
            }
            if (uVar31 != 0) {
              uVar30 = uVar30 + 1;
              auStack_238[uVar21 + 1] = uVar31;
            }
          }
        }
        else {
          for (; uVar21 = (ulong)big_full.used, 0x12 < exp; exp = exp + -0x13) {
            for (uVar24 = 0;
                (uVar31 = uVar21, uVar21 != uVar24 && (uVar31 = uVar24, big_full.bits[uVar24] == 0))
                ; uVar24 = uVar24 + 1) {
            }
            uVar24 = 0;
            for (; auVar16._8_8_ = 0, auVar16._0_8_ = uVar24, uVar31 < uVar21; uVar31 = uVar31 + 1)
            {
              auVar12._8_8_ = 0;
              auVar12._0_8_ = big_full.bits[uVar31];
              auVar16 = ZEXT816(10000000000000000000) * auVar12 + auVar16;
              uVar24 = auVar16._8_8_;
              big_full.bits[uVar31] = auVar16._0_8_;
            }
            if (uVar24 != 0) {
              big_full.used = big_full.used + 1;
              big_full.bits[uVar21] = uVar24;
            }
          }
          uVar30 = 1;
          if (exp != 0) {
            uVar24 = *(ulong *)(u64_pow10_table + (long)exp * 8);
            for (uVar31 = 0;
                (uVar36 = uVar21, uVar21 != uVar31 && (uVar36 = uVar31, big_full.bits[uVar31] == 0))
                ; uVar31 = uVar31 + 1) {
            }
            uVar31 = 0;
            for (; auVar18._8_8_ = 0, auVar18._0_8_ = uVar31, uVar36 < uVar21; uVar36 = uVar36 + 1)
            {
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar24;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = big_full.bits[uVar36];
              auVar18 = auVar7 * auVar14 + auVar18;
              uVar31 = auVar18._8_8_;
              big_full.bits[uVar36] = auVar18._0_8_;
            }
            if (uVar31 != 0) {
              big_full.used = big_full.used + 1;
              big_full.bits[uVar21] = uVar31;
            }
          }
        }
        if ((int)uVar27 < 1) {
          uVar34 = -uVar27 >> 6;
          uVar21 = (ulong)uVar34;
          uVar24 = (ulong)big_full.used;
          uVar27 = -uVar27 & 0x3f;
          if (uVar27 == 0) {
            while (uVar24 != 0) {
              big_full.bits[(int)uVar24 + (uVar34 - 1)] = big_full.bits[uVar24 - 1];
              uVar24 = uVar24 - 1;
            }
            big_full.used = big_full.used + uVar34;
            while (uVar21 != 0) {
              big_full.bits[uVar21 - 1] = 0;
              uVar21 = uVar21 - 1;
            }
          }
          else {
            big_full.bits[uVar24] = 0;
            sVar20 = (sbyte)uVar27;
            uVar27 = big_full.used + uVar34;
            while (uVar31 = uVar24 - 1, uVar31 != 0xffffffffffffffff) {
              big_full.bits[uVar27] =
                   big_full.bits[uVar31 & 0xffffffff] >> (0x40U - sVar20 & 0x3f) |
                   big_full.bits[uVar24] << sVar20;
              uVar27 = uVar27 - 1;
              uVar24 = uVar31;
            }
            big_full.bits[uVar21] = big_full.bits[0] << sVar20;
            big_full.used =
                 (big_full.used + uVar34 + 1) - (uint)(big_full.bits[big_full.used + uVar34] == 0);
            while (uVar21 != 0) {
              big_full.bits[uVar21 - 1] = 0;
              uVar21 = uVar21 - 1;
            }
          }
        }
        else {
          uVar34 = uVar27 >> 6;
          uVar21 = (ulong)uVar34;
          if ((uVar27 & 0x3f) == 0) {
            uVar24 = (ulong)uVar30;
            while (uVar24 != 0) {
              auStack_238[(ulong)((int)uVar24 + (uVar34 - 1)) + 1] = auStack_238[uVar24];
              uVar24 = uVar24 - 1;
            }
            uVar30 = uVar30 + uVar34;
            while (uVar21 != 0) {
              auStack_238[uVar21] = 0;
              uVar21 = uVar21 - 1;
            }
          }
          else {
            auStack_238[(ulong)uVar30 + 1] = 0;
            sVar20 = (sbyte)(uVar27 & 0x3f);
            uVar27 = uVar30 + uVar34;
            uVar24 = (ulong)uVar30;
            while (uVar31 = uVar24 - 1, uVar31 != 0xffffffffffffffff) {
              auStack_238[(ulong)uVar27 + 1] =
                   auStack_238[(uVar31 & 0xffffffff) + 1] >> (0x40U - sVar20 & 0x3f) |
                   auStack_238[uVar24 + 1] << sVar20;
              uVar27 = uVar27 - 1;
              uVar24 = uVar31;
            }
            auStack_238[uVar21 + 1] = auStack_238[1] << sVar20;
            uVar30 = (uVar30 + uVar34 + 1) - (uint)(auStack_238[(ulong)(uVar30 + uVar34) + 1] == 0);
            while (uVar21 != 0) {
              auStack_238[uVar21] = 0;
              uVar21 = uVar21 - 1;
            }
          }
        }
        uVar21 = (ulong)big_full.used;
        if (big_full.used < uVar30) {
LAB_01f46524:
          uVar24 = 0;
        }
        else {
          uVar24 = 1;
          if (big_full.used <= uVar30) {
            do {
              if (uVar21 == 0) {
                uVar24 = (ulong)((uint)uVar42 & 1);
                break;
              }
              puVar1 = auStack_238 + uVar21;
              lVar29 = uVar21 - 1;
              if (big_full.bits[lVar29] < *puVar1) goto LAB_01f46524;
              uVar21 = uVar21 - 1;
            } while (big_full.bits[lVar29] <= *puVar1);
          }
        }
        if (uVar24 + uVar42 != 0x7ff0000000000000) {
          local_468->tag = 0x14;
          (local_468->uni).u64 = uVar24 + uVar42 | (ulong)(cVar2 == '-') << 0x3f;
          return (char *)pbVar43;
        }
        if (-1 < cVar40) {
          dat = (char *)local_458;
          if ((flg & 0x10) != 0) {
            local_468->tag = 0x14;
            if (cVar2 == '-') {
              uVar38 = 0xfff0000000000000;
            }
            (local_468->uni).u64 = uVar38;
            return (char *)pbVar43;
          }
          goto LAB_01f45c8c;
        }
        if (*ppuVar28 != (u8 *)0x0) {
          **ppuVar28 = '\0';
        }
      }
      else {
        uVar3 = 0x3f;
        if (uVar42 != 0) {
          for (; uVar42 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar27 = (uVar27 + iVar26) - (int)(uVar3 ^ 0x3f);
        if ((int)uVar27 < 0x3c1) {
          uVar42 = (uVar42 << ((byte)(uVar3 ^ 0x3f) & 0x3f)) >> 0xb;
          if ((int)uVar27 < -0x43d) {
            if (uVar27 < 0xfffffb8f) goto LAB_01f45d7b;
            uVar42 = uVar42 >> (-(char)uVar27 - 0x3dU & 0x3f);
          }
          else {
            uVar42 = uVar42 & 0xfffffffffffff | (ulong)(uVar27 + 0x43e) << 0x34;
            if (uVar42 == 0x7ff0000000000000) goto LAB_01f45c67;
          }
          goto LAB_01f45bc9;
        }
LAB_01f45c67:
        if (-1 < cVar40) {
          if ((flg & 0x10) != 0) {
            val->tag = 0x14;
            (val->uni).str = (char *)(((ulong)(cVar2 != '-') << 0x3f) + -0x10000000000000);
            return (char *)pbVar43;
          }
          goto LAB_01f45c8c;
        }
        if (*ppuVar28 != (u8 *)0x0) {
          **ppuVar28 = '\0';
        }
      }
      local_468->tag = ((long)pbVar43 - (long)local_458) * 0x100 + 1;
      (local_468->uni).str = (char *)local_458;
LAB_01f46468:
      *ppuVar28 = pbVar43;
      return (char *)pbVar43;
    }
    pbVar43 = pbVar37 + 1;
    if ((digi_table[bVar23] & 0x30) == 0) {
      val->tag = (ulong)(cVar2 == '-') * 8 + 4;
      if (cVar2 == '-') {
        uVar24 = 0x30 - uVar21;
      }
      (val->uni).u64 = uVar24;
      return (char *)pbVar43;
    }
    pbVar39 = pbVar37;
    local_480 = pbVar43;
    if (bVar23 != 0x2e) goto LAB_01f451ef;
LAB_01f46116:
    pbVar43 = pbVar37 + 1;
    bVar32 = pbVar39[2];
    if ((ulong)bVar32 - 0x30 < 10) {
      uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
      pbVar37 = pbVar39;
LAB_01f46149:
      bVar32 = pbVar37[3];
      if ((ulong)bVar32 - 0x30 < 10) {
        uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f46166:
        bVar32 = pbVar37[4];
        if ((ulong)bVar32 - 0x30 < 10) {
          uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f46183:
          bVar32 = pbVar37[5];
          if ((ulong)bVar32 - 0x30 < 10) {
            uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f461a0:
            bVar32 = pbVar37[6];
            if ((ulong)bVar32 - 0x30 < 10) {
              uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f461bd:
              bVar32 = pbVar37[7];
              if ((ulong)bVar32 - 0x30 < 10) {
                uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f461da:
                bVar32 = pbVar37[8];
                if ((ulong)bVar32 - 0x30 < 10) {
                  uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f461f7:
                  bVar32 = pbVar37[9];
                  if ((ulong)bVar32 - 0x30 < 10) {
                    uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f46214:
                    bVar32 = pbVar37[10];
                    if ((ulong)bVar32 - 0x30 < 10) {
                      uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f46231:
                      bVar32 = pbVar37[0xb];
                      if ((ulong)bVar32 - 0x30 < 10) {
                        uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f4624e:
                        bVar32 = pbVar37[0xc];
                        if ((ulong)bVar32 - 0x30 < 10) {
                          uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f4626b:
                          bVar32 = pbVar37[0xd];
                          if ((ulong)bVar32 - 0x30 < 10) {
                            uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f46288:
                            bVar32 = pbVar37[0xe];
                            if ((ulong)bVar32 - 0x30 < 10) {
                              uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f462a5:
                              bVar32 = pbVar37[0xf];
                              if ((ulong)bVar32 - 0x30 < 10) {
                                uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f462c2:
                                bVar32 = pbVar37[0x10];
                                if ((ulong)bVar32 - 0x30 < 10) {
                                  uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f462df:
                                  bVar32 = pbVar37[0x11];
                                  if ((ulong)bVar32 - 0x30 < 10) {
                                    uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f462fc:
                                    bVar32 = pbVar37[0x12];
                                    if ((ulong)bVar32 - 0x30 < 10) {
                                      uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
LAB_01f46319:
                                      bVar32 = pbVar37[0x13];
                                      local_450 = pbVar43;
                                      if ((ulong)bVar32 - 0x30 < 10) {
                                        uVar24 = ((ulong)bVar32 - 0x30) + uVar24 * 10;
                                        bVar32 = pbVar37[0x14];
                                        local_478 = pbVar37 + 0x14;
                                        if ((digi_table[bVar32] & 3) != 0) goto LAB_01f452a3;
                                      }
                                      else {
                                        local_478 = pbVar37 + 0x13;
                                      }
                                    }
                                    else {
                                      local_478 = pbVar37 + 0x12;
                                      local_450 = pbVar43;
                                    }
                                  }
                                  else {
                                    local_478 = pbVar37 + 0x11;
                                    local_450 = pbVar43;
                                  }
                                }
                                else {
                                  local_478 = pbVar37 + 0x10;
                                  local_450 = pbVar43;
                                }
                              }
                              else {
                                local_478 = pbVar37 + 0xf;
                                local_450 = pbVar43;
                              }
                            }
                            else {
                              local_478 = pbVar37 + 0xe;
                              local_450 = pbVar43;
                            }
                          }
                          else {
                            local_478 = pbVar37 + 0xd;
                            local_450 = pbVar43;
                          }
                        }
                        else {
                          local_478 = pbVar37 + 0xc;
                          local_450 = pbVar43;
                        }
                      }
                      else {
                        local_478 = pbVar37 + 0xb;
                        local_450 = pbVar43;
                      }
                    }
                    else {
                      local_478 = pbVar37 + 10;
                      local_450 = pbVar43;
                    }
                  }
                  else {
                    local_478 = pbVar37 + 9;
                    local_450 = pbVar43;
                  }
                }
                else {
                  local_478 = pbVar37 + 8;
                  local_450 = pbVar43;
                }
              }
              else {
                local_478 = pbVar37 + 7;
                local_450 = pbVar43;
              }
            }
            else {
              local_478 = pbVar37 + 6;
              local_450 = pbVar43;
            }
          }
          else {
            local_478 = pbVar37 + 5;
            local_450 = pbVar43;
          }
        }
        else {
          local_478 = pbVar37 + 4;
          local_450 = pbVar43;
        }
      }
      else {
        local_478 = pbVar37 + 3;
        local_450 = pbVar43;
      }
    }
    else {
      local_478 = pbVar39 + 2;
      local_450 = pbVar43;
    }
    if (local_450 + 1 == local_478) {
      msg = "no digit after decimal point";
      goto LAB_01f455e1;
    }
    pbVar39 = local_450 + (1 - (long)local_478);
    local_480 = local_478;
    if ((digi_table[bVar32] & 0x20) == 0) {
      pbVar43 = local_478;
      if ((long)pbVar39 < -0x157) goto LAB_01f4638e;
      pbVar37 = (byte *)0x0;
      goto LAB_01f45444;
    }
    pbVar37 = (byte *)0x0;
LAB_01f45386:
    bVar23 = local_478[1];
    uVar21 = (ulong)((digi_table[bVar23] & 0xc) != 0);
    if ((digi_table[local_478[uVar21 + 1]] & 3) == 0) {
      msg = "no digit after exponent sign";
      local_478 = local_478 + uVar21 + 1;
      goto LAB_01f455e1;
    }
    pbVar43 = local_478 + uVar21;
    uVar38 = (long)pbVar43 * 0x100 + (long)dat * -0x100 + 1;
    do {
      bVar32 = pbVar43[1];
      pbVar43 = pbVar43 + 1;
      uVar38 = uVar38 + 0x100;
    } while (bVar32 == 0x30);
    lVar29 = 0;
    lVar41 = 0;
    while ((digi_table[bVar32] & 3) != 0) {
      lVar41 = lVar41 * 10 + (ulong)(byte)(bVar32 - 0x30);
      bVar32 = pbVar43[1];
      pbVar43 = pbVar43 + 1;
      uVar38 = uVar38 + 0x100;
      lVar29 = lVar29 + 1;
    }
    if (lVar29 < 0x13) {
      lVar29 = -lVar41;
      if (bVar23 != 0x2d) {
        lVar29 = lVar41;
      }
      pbVar39 = pbVar39 + lVar29;
      goto LAB_01f4542a;
    }
    if (bVar23 == 0x2d) {
      val->tag = 0x14;
      (val->uni).u64 = (ulong)(cVar2 == '-') << 0x3f;
      return (char *)pbVar43;
    }
    if (cVar40 < '\0') {
      if (*ppuVar28 != (u8 *)0x0) {
        **ppuVar28 = '\0';
      }
      val->tag = uVar38;
      (val->uni).str = dat;
      goto LAB_01f46468;
    }
    if ((flg & 0x10) != 0) {
      val->tag = 0x14;
      (val->uni).str = (char *)(((ulong)(cVar2 != '-') << 0x3f) + -0x10000000000000);
      return (char *)pbVar43;
    }
LAB_01f45c8c:
    msg = "number is infinity when parsed as double";
    local_478 = (byte *)dat;
    goto LAB_01f455e1;
  }
  if (bVar23 == 0x30) {
    local_478 = pbVar37 + 1;
    bVar23 = digi_table[pbVar37[1]];
    if ((bVar23 & 0x33) == 0) {
      val->tag = (ulong)(cVar2 == '-') * 8 + 4;
      (val->uni).u64 = 0;
      return (char *)local_478;
    }
    if (pbVar37[1] == 0x2e) {
      if ((digi_table[pbVar37[2]] & 3) == 0) {
        local_478 = pbVar37 + 2;
LAB_01f45177:
        msg = "no digit after decimal point";
        goto LAB_01f455e1;
      }
      local_478 = (byte *)(dat + uVar24 + 1);
      do {
        pbVar39 = local_478;
        uVar24 = (ulong)pbVar39[1];
        local_478 = pbVar39 + 1;
      } while (uVar24 == 0x30);
      bVar23 = digi_table[uVar24];
      if ((bVar23 & 3) != 0) {
        uVar24 = uVar24 - 0x30;
        goto LAB_01f46116;
      }
    }
    if ((bVar23 & 3) == 0) {
      if ((bVar23 & 0x20) != 0) {
        bVar45 = (digi_table[local_478[1]] & 0xc) == 0;
        pbVar37 = local_478 + (2 - (ulong)bVar45);
        local_478 = local_478 + (2 - (ulong)bVar45);
        if ((digi_table[*pbVar37] & 3) == 0) {
          msg = "no digit after exponent sign";
          goto LAB_01f455e1;
        }
        do {
          pbVar37 = local_478 + 1;
          local_478 = local_478 + 1;
        } while ((digi_table[*pbVar37] & 3) != 0);
      }
      val->tag = 0x14;
      (val->uni).u64 = (ulong)(cVar2 == '-') << 0x3f;
      return (char *)local_478;
    }
    msg = "number with leading zero is not allowed";
    local_478 = local_478 + -1;
    goto LAB_01f455e1;
  }
  if ((flg & 0x10) != 0) {
    uVar42 = (long)pbVar37 - (ulong)(cVar2 == '-');
    if (uVar21 == 0x49) {
LAB_01f466b6:
      if (((pbVar37[1] | 0x20) == 0x6e) && ((pbVar37[2] | 0x20) == 0x66)) {
        pbVar43 = pbVar37 + 3;
        if ((((pbVar37[3] | 0x20) == 0x69) &&
            ((((pbVar37[4] | 0x20) == 0x6e && ((pbVar37[5] | 0x20) == 0x69)) &&
             ((pbVar37[6] | 0x20) == 0x74)))) && ((pbVar37[7] | 0x20) == 0x79)) {
          pbVar43 = pbVar37 + 8;
        }
        if ((flg & 0xa0) == 0) {
LAB_01f4673f:
          val->tag = 0x14;
          (val->uni).str = (char *)(((ulong)(cVar2 != '-') << 0x3f) + -0x10000000000000);
          return (char *)pbVar43;
        }
        val->tag = ((long)pbVar43 - uVar42) * 0x100 + 1;
LAB_01f45592:
        (val->uni).u64 = uVar42;
        return (char *)pbVar43;
      }
      if ((bVar23 | 0x20) != 0x6e) goto LAB_01f4609b;
    }
    else if ((bVar23 != 0x4e) && (bVar23 != 0x6e)) {
      if (bVar23 != 0x69) goto LAB_01f4609b;
      goto LAB_01f466b6;
    }
    if (((pbVar37[1] | 0x20) == 0x61) && ((pbVar37[2] | 0x20) == 0x6e)) {
      if ((flg & 0xa0) == 0) {
        val->tag = 0x14;
        (val->uni).str = (char *)(((ulong)(cVar2 != '-') << 0x3f) + -0x8000000000000);
        return (char *)(pbVar37 + 3);
      }
      val->tag = (ulong)(cVar2 == '-') * 0x100 + 0x301;
      (val->uni).u64 = uVar42;
      return (char *)(pbVar37 + 3);
    }
  }
LAB_01f4609b:
  msg = "no digit after minus sign";
  local_478 = pbVar37;
LAB_01f455e1:
  if (err == (yyjson_read_err *)0x0) {
    return (char *)0x0;
  }
  pbVar37 = local_478 + -(long)dat;
  if (local_478 < dat || local_478 + -(long)dat == (byte *)0x0) {
    pbVar37 = (byte *)0x0;
  }
  err->pos = (size_t)pbVar37;
  err->msg = msg;
  err->code = 9;
  return (char *)0x0;
}

Assistant:

const char *yyjson_read_number(const char *dat,
                               yyjson_val *val,
                               yyjson_read_flag flg,
                               const yyjson_alc *alc,
                               yyjson_read_err *err) {
#define return_err(_pos, _code, _msg) do { \
    err->pos = _pos > hdr ? (usize)(_pos - hdr) : 0; \
    err->msg = _msg; \
    err->code = YYJSON_READ_ERROR_##_code; \
    return NULL; \
} while (false)

    u8 *hdr = constcast(u8 *)dat, *cur = hdr;
    bool raw; /* read number as raw */
    u8 *raw_end; /* raw end for null-terminator */
    u8 **pre; /* previous raw end pointer */
    const char *msg;
    yyjson_read_err dummy_err;

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    u8 buf[128];
    usize dat_len;
#endif

    if (!err) err = &dummy_err;
    if (unlikely(!dat)) {
        return_err(cur, INVALID_PARAMETER, "input data is NULL");
    }
    if (unlikely(!val)) {
        return_err(cur, INVALID_PARAMETER, "output value is NULL");
    }

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    if (!alc) alc = &YYJSON_DEFAULT_ALC;
    dat_len = strlen(dat);
    if (dat_len < sizeof(buf)) {
        memcpy(buf, dat, dat_len + 1);
        hdr = buf;
        cur = hdr;
    } else {
        hdr = (u8 *)alc->malloc(alc->ctx, dat_len + 1);
        cur = hdr;
        if (unlikely(!hdr)) {
            return_err(cur, MEMORY_ALLOCATION, "memory allocation failed");
        }
        memcpy(hdr, dat, dat_len + 1);
    }
    hdr[dat_len] = 0;
#endif

    raw = (flg & (YYJSON_READ_NUMBER_AS_RAW | YYJSON_READ_BIGNUM_AS_RAW)) != 0;
    raw_end = NULL;
    pre = raw ? &raw_end : NULL;

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    if (!read_number(&cur, pre, flg, val, &msg)) {
        if (dat_len >= sizeof(buf)) alc->free(alc->ctx, hdr);
        return_err(cur, INVALID_NUMBER, msg);
    }
    if (dat_len >= sizeof(buf)) alc->free(alc->ctx, hdr);
    if (yyjson_is_raw(val)) val->uni.str = dat;
    return dat + (cur - hdr);
#else
    if (!read_number(&cur, pre, flg, val, &msg)) {
        return_err(cur, INVALID_NUMBER, msg);
    }
    return (const char *)cur;
#endif

#undef return_err
}